

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  uint32_t uVar5;
  cTValue *in_RDX;
  GCtab *in_RSI;
  long in_RDI;
  Node *mn;
  Node *nn;
  Node *freenode;
  Node *collide;
  Node *nodebase;
  Node *n;
  Node *n_1;
  GCobj *o;
  TValue *local_78;
  TValue *local_70;
  cTValue *in_stack_ffffffffffffff98;
  
  pTVar2 = &hashkey(in_RSI,in_RDX)->val;
  if (((pTVar2->field_2).it != 0xffffffff) || (in_RSI->hmask == 0)) {
    pTVar3 = (TValue *)(ulong)(in_RSI->node).ptr32;
    pTVar4 = (TValue *)(ulong)((MRef *)((long)pTVar3 + 0x14))->ptr32;
    do {
      local_70 = pTVar4;
      if (local_70 == pTVar3) {
        rehashtab((lua_State *)collide,(GCtab *)freenode,&nn->val);
        pTVar2 = lj_tab_set((lua_State *)&pTVar2->field_2,(GCtab *)&pTVar3->field_2,
                            in_stack_ffffffffffffff98);
        return pTVar2;
      }
      pTVar4 = local_70 + -3;
    } while (*(int *)((long)local_70 + -0xc) != -1);
    uVar5 = (uint32_t)pTVar4;
    ((MRef *)((long)pTVar3 + 0x14))->ptr32 = uVar5;
    pTVar3 = &hashkey(in_RSI,pTVar2 + 1)->val;
    if (pTVar3 == pTVar2) {
      local_70[-1].field_2.field_0 = pTVar2[2].field_2.field_0;
      pTVar2[2].u32.lo = uVar5;
      pTVar2 = pTVar4;
    }
    else {
      while ((TValue *)(ulong)pTVar3[2].u32.lo != pTVar2) {
        pTVar3 = (TValue *)(ulong)pTVar3[2].u32.lo;
      }
      pTVar3[2].u32.lo = uVar5;
      pTVar4->field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pTVar2;
      local_70[-2] = pTVar2[1];
      local_70[-1].field_2.field_0 = pTVar2[2].field_2.field_0;
      pTVar2[2].u32.lo = 0;
      (pTVar2->field_2).it = 0xffffffff;
      if (*(int *)((long)pTVar2 + 0xc) == -5) {
        do {
          local_70 = pTVar4;
          local_78 = (TValue *)(ulong)local_70[2].u32.lo;
          if (local_78 == (TValue *)0x0) goto LAB_0012e815;
          pTVar4 = local_78;
        } while (((local_78->field_2).it == 0xffffffff) ||
                (pTVar3 = &hashkey(in_RSI,local_78 + 1)->val, pTVar4 = local_78, pTVar3 != pTVar2));
      }
      else {
        do {
          local_70 = pTVar4;
          local_78 = (TValue *)(ulong)local_70[2].u32.lo;
          if (local_78 == (TValue *)0x0) goto LAB_0012e815;
          pTVar4 = local_78;
        } while (((*(int *)((long)local_78 + 0xc) != -5) ||
                 (pTVar4 = local_78, (local_78->field_2).it == 0xffffffff)) ||
                (pTVar4 = local_78,
                (TValue *)
                ((ulong)(in_RSI->node).ptr32 +
                (ulong)(*(uint *)((ulong)local_78[1].u32.lo + 8) & in_RSI->hmask) * 0x18) != pTVar2)
                );
      }
      local_70[2].field_2.field_0 = local_78[2].field_2.field_0;
      local_78[2].field_2.field_0 = pTVar2[2].field_2.field_0;
      pTVar2[2].u32.lo = (uint32_t)local_78;
      pTVar4 = local_70;
      while( true ) {
        local_70 = pTVar4;
        uVar1 = local_70[2].u32.lo;
        pTVar4 = (TValue *)(ulong)uVar1;
        if (pTVar4 == (TValue *)0x0) break;
        if ((((pTVar4->field_2).it != 0xffffffff) &&
            (pTVar3 = &hashkey(in_RSI,pTVar4 + 1)->val, pTVar3 != local_70)) && (pTVar3 != pTVar4))
        {
          local_70[2].field_2.field_0 = pTVar4[2].field_2.field_0;
          pTVar4[2].field_2.field_0 = pTVar3[2].field_2.field_0;
          pTVar3[2].u32.lo = uVar1;
          pTVar4 = local_70;
        }
      }
    }
  }
LAB_0012e815:
  pTVar2[1] = *in_RDX;
  if (pTVar2[1].u64 == 0x8000000000000000) {
    pTVar2[1].u64 = 0;
  }
  if ((in_RSI->marked & 4) != 0) {
    uVar1 = *(uint *)(in_RDI + 8);
    in_RSI->marked = in_RSI->marked & 0xfb;
    (in_RSI->gclist).gcptr32 = *(uint32_t *)((ulong)uVar1 + 0x6c);
    *(int *)((ulong)uVar1 + 0x6c) = (int)in_RSI;
  }
  return pTVar2;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = getfreetop(t, nodebase);
    lj_assertL(freenode >= nodebase && freenode <= nodebase+t->hmask+1,
	       "bad freenode");
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setfreetop(t, nodebase, freenode);
    lj_assertL(freenode != &G(L)->nilnode, "store to fallback hash");
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      Node *nn;
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /*
      ** Nodes after n might have n as their main node, and need rechaining
      ** back onto n. We make use of the following property of tables: for all
      ** nodes m, at least one of the following four statements is true:
      **  1. tvisnil(&m->key)  NB: tvisnil(&m->val) is a stronger statement
      **  2. tvisstr(&m->key)
      **  3. tvisstr(&main(m)->key)
      **  4. main(m) == main(main(m))
      ** Initially, we need to rechain any nn which has main(nn) == n. As
      ** main(n) != n (because collide != n earlier), main(nn) == n requires
      ** either statement 2 or statement 3 to be true about nn.
      */
      if (!tvisstr(&n->key)) {
	/* Statement 3 is not true, so only need to consider string keys. */
	while ((nn = nextnode(freenode))) {
	  if (tvisstr(&nn->key) && !tvisnil(&nn->val) &&
	      hashstr(t, strV(&nn->key)) == n) {
	    goto rechain;
	  }
	  freenode = nn;
	}
      } else {
	/* Statement 3 is true, so need to consider all types of key. */
	while ((nn = nextnode(freenode))) {
	  if (!tvisnil(&nn->val) && hashkey(t, &nn->key) == n) {
	  rechain:
	    freenode->next = nn->next;
	    nn->next = n->next;
	    setmref(n->next, nn);
	    /*
	    ** Rechaining one node onto n creates a new dilemma: we now need
	    ** to rechain any nn which has main(nn) == n OR has main(nn) equal
	    ** to any node which has already been rechained. Furthermore, at
	    ** least one of n and n->next will have a string key, so all types
	    ** of nn key need to be considered. Rather than testing whether
	    ** main(nn) definitely _is_ in the new chain, we test whether it
	    ** might _not_ be in the old chain, and if so re-link it into
	    ** the correct chain.
	    */
	    while ((nn = nextnode(freenode))) {
	      if (!tvisnil(&nn->val)) {
		Node *mn = hashkey(t, &nn->key);
		if (mn != freenode && mn != nn) {
		  freenode->next = nn->next;
		  nn->next = mn->next;
		  setmref(mn->next, nn);
		} else {
		  freenode = nn;
		}
	      } else {
		freenode = nn;
	      }
	    }
	    break;
	  } else {
	    freenode = nn;
	  }
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lj_assertL(tvisnil(&n->val), "new hash slot is not empty");
  return &n->val;
}